

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_string.c
# Opt level: O1

int mk_string_itop(uint64_t value,mk_ptr_t *p)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = digits10(value);
  uVar7 = (ulong)(uVar4 - 1);
  pcVar2 = p->data;
  uVar5 = value;
  if (99 < value) {
    do {
      value = uVar5 / 100;
      uVar8 = (ulong)(uint)((int)uVar5 + (int)value * -100);
      cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [uVar8 * 2];
      pcVar2[uVar7] =
           "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
           [uVar8 * 2 + 1];
      pcVar2[(int)uVar7 - 1] = cVar1;
      uVar7 = (ulong)((int)uVar7 - 2);
      bVar3 = 9999 < uVar5;
      uVar5 = value;
    } while (bVar3);
  }
  if (value < 10) {
    bVar6 = (byte)value | 0x30;
  }
  else {
    pcVar2[uVar7] =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [(value * 2 & 0xffffffff) + 1];
    bVar6 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [value * 2 & 0x1fffffffe];
    uVar7 = (ulong)((int)uVar7 - 1);
  }
  pcVar2[uVar7] = bVar6;
  pcVar2 = p->data;
  uVar5 = (ulong)uVar4;
  (pcVar2 + uVar5)[0] = '\r';
  (pcVar2 + uVar5)[1] = '\n';
  pcVar2[uVar5 + 2] = '\0';
  p->len = (unsigned_long)(pcVar2 + ~(ulong)p->data + uVar5 + 3);
  return (int)(pcVar2 + ~(ulong)p->data + uVar5 + 3);
}

Assistant:

int mk_string_itop(uint64_t value, mk_ptr_t *p)
{
    static const char digits[201] =
        "0001020304050607080910111213141516171819"
        "2021222324252627282930313233343536373839"
        "4041424344454647484950515253545556575859"
        "6061626364656667686970717273747576777879"
        "8081828384858687888990919293949596979899";

    uint32_t const length = digits10(value);
    uint32_t next = length - 1;
    char *dst = p->data;

    while (value >= 100) {
        int const i = (value % 100) * 2;
        value /= 100;
        dst[next] = digits[i + 1];
        dst[next - 1] = digits[i];
        next -= 2;
    }

    /* Handle last 1-2 digits */
    if (value < 10) {
        dst[next] = '0' + (uint32_t) value;
    }
    else {
        int i = (uint32_t) value * 2;
        dst[next] = digits[i + 1];
        dst[next - 1] = digits[i];
    }

    dst = p->data + length;
    *dst++ = '\r';
    *dst++ = '\n';
    *dst++ = '\0';

    p->len = (dst - p->data - 1);
    return p->len;
}